

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_opcode_non_inst_(uint *quads,sh4asm_disas_emit_func em)

{
  char **local_60;
  char *outp;
  char buf [64];
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  buf._56_8_ = em;
  memset(&outp,0,0x40);
  snprintf((char *)&outp,0x40,".byte %x%x\n.byte %x%x\n",(ulong)*quads,(ulong)quads[1],
           (ulong)quads[2],quads[3]);
  buf[0x37] = '\0';
  local_60 = &outp;
  while (*(char *)local_60 != '\0') {
    (*(code *)buf._56_8_)((int)*(char *)local_60);
    local_60 = (char **)((long)local_60 + 1);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_opcode_non_inst_(unsigned const *quads, sh4asm_disas_emit_func em) {
#define NON_INST_BUF_LEN 64
    char buf[NON_INST_BUF_LEN];
    memset(buf, 0, sizeof(buf));
    // TODO: make sure the quads get printed in the right order
    snprintf(buf, NON_INST_BUF_LEN, ".byte %x%x\n.byte %x%x\n",
             quads[0], quads[1], quads[2], quads[3]);
    buf[NON_INST_BUF_LEN - 1] = '\0';
    char const *outp = buf;
    while (*outp)
        em(*outp++);
}